

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

double google::protobuf::io::Tokenizer::ParseFloat(string *text)

{
  char *text_00;
  byte *pbVar1;
  LogMessage *pLVar2;
  byte bVar3;
  char *end;
  LogFinisher local_81;
  byte *local_80;
  double local_78;
  string local_70;
  LogMessage local_50;
  
  text_00 = (text->_M_dataplus)._M_p;
  local_78 = NoLocaleStrtod(text_00,(char **)&local_80);
  bVar3 = *local_80;
  pbVar1 = local_80;
  if ((bVar3 | 0x20) == 0x65) {
    bVar3 = local_80[1];
    if ((bVar3 == 0x2d) || (pbVar1 = local_80 + 1, bVar3 == 0x2b)) {
      bVar3 = local_80[2];
      pbVar1 = local_80 + 2;
    }
  }
  local_80 = pbVar1;
  if ((bVar3 | 0x20) == 0x66) {
    local_80 = local_80 + 1;
  }
  if (((long)local_80 - (long)text_00 != text->_M_string_length) || (*text_00 == '-')) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x397);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,
                        " Tokenizer::ParseFloat() passed text that could not have been tokenized as a float: "
                       );
    CEscape(&local_70,text);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,&local_70);
    internal::LogFinisher::operator=(&local_81,pLVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    internal::LogMessage::~LogMessage(&local_50);
  }
  return local_78;
}

Assistant:

double Tokenizer::ParseFloat(const string& text) {
  const char* start = text.c_str();
  char* end;
  double result = NoLocaleStrtod(start, &end);

  // "1e" is not a valid float, but if the tokenizer reads it, it will
  // report an error but still return it as a valid token.  We need to
  // accept anything the tokenizer could possibly return, error or not.
  if (*end == 'e' || *end == 'E') {
    ++end;
    if (*end == '-' || *end == '+') ++end;
  }

  // If the Tokenizer had allow_f_after_float_ enabled, the float may be
  // suffixed with the letter 'f'.
  if (*end == 'f' || *end == 'F') {
    ++end;
  }

  GOOGLE_LOG_IF(DFATAL, end - start != text.size() || *start == '-')
    << " Tokenizer::ParseFloat() passed text that could not have been"
       " tokenized as a float: " << CEscape(text);
  return result;
}